

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1corr.c
# Opt level: O0

void test_1to1000(void)

{
  void *pvVar1;
  void *pvVar2;
  long i_1;
  long i;
  void *c;
  void *local_18;
  uintptr_t local_10;
  
  pvVar1 = (*hm_new)();
  for (local_10 = 0; (long)local_10 < 1000; local_10 = local_10 + 1) {
    (*hm_insert)(pvVar1,local_10,(void *)local_10,0);
  }
  local_18 = (void *)0x0;
  while( true ) {
    if (999 < (long)local_18) {
      (*hm_delete)(pvVar1);
      return;
    }
    pvVar2 = (*hm_get)(pvVar1,(uintptr_t)local_18);
    if (pvVar2 != local_18) break;
    local_18 = (void *)((long)local_18 + 1);
  }
  pvVar1 = (*hm_get)(pvVar1,(uintptr_t)local_18);
  printf(anon_var_dwarf_28f,"hm_get(c, i)",pvVar1,"(void*)i",local_18,0x2d);
  bad = 1;
  exit(1);
}

Assistant:

static void test_1to1000()
{
    void *c = hm_new();
    for (long i=0; i<1000; i++)
        hm_insert(c, i, (void*)i, 0);
    for (long i=0; i<1000; i++)
        CHECK(hm_get(c, i), (void*)i);
    hm_delete(c);
}